

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignatureRefining.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_171::SignatureRefining::run::CodeUpdater::~CodeUpdater(CodeUpdater *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>_>).
           super_PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>.
           super_Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>_>
                                          ).
                                          super_PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>
                                          .
                                          super_Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }